

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.h
# Opt level: O1

int decoder_get_uint_value(ndn_decoder_t *decoder,uint32_t length,uint64_t *value)

{
  uint8_t *puVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint64_t uVar8;
  
  iVar2 = -0xd;
  switch(length) {
  case 1:
    uVar6 = decoder->offset + 1;
    iVar2 = 0;
    if (decoder->input_size < uVar6) {
      uVar4 = 0;
    }
    else {
      uVar4 = (ulong)decoder->input_value[decoder->offset];
      decoder->offset = uVar6;
    }
    *value = uVar4;
    break;
  case 2:
    uVar6 = decoder->offset;
    iVar2 = 0;
    if (decoder->input_size < uVar6 + 2) {
      uVar8 = 0;
    }
    else {
      uVar8 = (uint64_t)CONCAT11(decoder->input_value[uVar6],decoder->input_value[uVar6 + 1]);
      decoder->offset = uVar6 + 2;
    }
    *value = uVar8;
    break;
  case 4:
    uVar7 = decoder->offset;
    uVar6 = uVar7 + 4;
    uVar4 = 0;
    if (uVar6 <= decoder->input_size) {
      lVar5 = 0x20;
      do {
        lVar5 = lVar5 + -8;
        uVar3 = (int)uVar4 + ((uint)decoder->input_value[uVar7] << ((byte)lVar5 & 0x1f));
        uVar4 = (ulong)uVar3;
        uVar7 = uVar7 + 1;
      } while (lVar5 != 0);
      decoder->offset = uVar6;
      uVar4 = (ulong)uVar3;
    }
    *value = uVar4;
    goto LAB_0011027e;
  case 8:
    uVar7 = decoder->offset;
    uVar6 = uVar7 + 8;
    if (decoder->input_size < uVar6) {
      return 0;
    }
    *value = 0;
    puVar1 = decoder->input_value;
    lVar5 = 0x38;
    uVar8 = 0;
    do {
      uVar8 = uVar8 + ((ulong)puVar1[uVar7] << ((byte)lVar5 & 0x3f));
      *value = uVar8;
      lVar5 = lVar5 + -8;
      uVar7 = uVar7 + 1;
    } while (lVar5 != -8);
    decoder->offset = uVar6;
LAB_0011027e:
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static inline int
decoder_get_uint_value(ndn_decoder_t* decoder, uint32_t length, uint64_t* value)
{
  if (length == 1) {
    uint8_t temp_value = 0;
    decoder_get_byte_value(decoder, &temp_value);
    *value = (uint64_t)temp_value;
  }
  else if (length == 2) {
    uint16_t temp_value = 0;
    decoder_get_uint16_value(decoder, &temp_value);
    *value = (uint64_t)temp_value;
  }
  else if (length == 4) {
    uint32_t temp_value = 0;
    decoder_get_uint32_value(decoder, &temp_value);
    *value = (uint64_t)temp_value;
  }
  else if (length == 8) {
    decoder_get_uint64_value(decoder, value);
  }
  else {
    return NDN_WRONG_TLV_LENGTH;
  }
  return 0;
}